

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void free_old_nodes(Parser *p)

{
  uint32 *puVar1;
  uint uVar2;
  SNode *pSVar3;
  SNode *pSVar4;
  PNode *pn;
  SNode **ppSVar5;
  PNode **ppPVar6;
  uint uVar7;
  SNode *pSVar8;
  SNode **ppSVar9;
  PNode **ppPVar10;
  PNode *pPVar11;
  PNode *pPVar12;
  ulong uVar13;
  
  pPVar11 = (p->pnode_hash).all;
  pSVar8 = (p->snode_hash).all;
  if (pSVar8 != (SNode *)0x0) {
    uVar2 = (p->snode_hash).m;
    do {
      pSVar3 = pSVar8->all_next;
      ppSVar5 = (p->snode_hash).v +
                (ulong)(((uint)(*(int *)&pSVar8->state - *(int *)&p->t->state) >> 3) * -0x11111000 +
                       *(int *)&pSVar8->initial_scope) % (ulong)uVar2;
      do {
        ppSVar9 = ppSVar5;
        pSVar4 = *ppSVar9;
        ppSVar5 = &pSVar4->bucket_next;
      } while (pSVar4 != pSVar8);
      *ppSVar9 = *ppSVar5;
      pSVar8 = pSVar3;
    } while (pSVar3 != (SNode *)0x0);
  }
  pSVar8 = (p->snode_hash).last_all;
  (p->snode_hash).last_all = (SNode *)0x0;
  while (pSVar3 = pSVar8, pSVar3 != (SNode *)0x0) {
    pSVar8 = pSVar3->all_next;
    puVar1 = &pSVar3->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_SNode(p,pSVar3);
    }
  }
  (p->snode_hash).last_all = (p->snode_hash).all;
  (p->snode_hash).all = (SNode *)0x0;
  while (pn = pPVar11, pn != (PNode *)0x0) {
    uVar7 = (pn->children).n;
    if (uVar7 != 0) {
      ppPVar6 = (pn->children).v;
      uVar13 = 0;
      do {
        pPVar11 = ppPVar6[uVar13];
        pPVar12 = pPVar11->latest;
        if (pPVar11 != pPVar12) {
          do {
            pPVar12->refcount = pPVar12->refcount + 1;
            puVar1 = &pPVar11->refcount;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) {
              free_PNode(p,pPVar11);
              ppPVar6 = (pn->children).v;
            }
            ppPVar6[uVar13] = pPVar12;
            ppPVar6 = (pn->children).v;
            pPVar11 = ppPVar6[uVar13];
            pPVar12 = pPVar11->latest;
          } while (pPVar11 != pPVar12);
          uVar7 = (pn->children).n;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar7);
    }
    pPVar11 = pn->all_next;
    ppPVar6 = (p->pnode_hash).v +
              (ulong)(uint)(*(int *)&(pn->parse_node).end_skip * 0x10000 +
                            *(int *)&(pn->parse_node).start_loc.s * 0x100 + (pn->parse_node).symbol
                           + *(int *)&pn->initial_scope) % (ulong)(p->pnode_hash).m;
    do {
      ppPVar10 = ppPVar6;
      pPVar12 = *ppPVar10;
      ppPVar6 = &pPVar12->bucket_next;
    } while (pPVar12 != pn);
    *ppPVar10 = *ppPVar6;
    puVar1 = &pn->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pn);
    }
  }
  (p->pnode_hash).n = 0;
  (p->pnode_hash).all = (PNode *)0x0;
  return;
}

Assistant:

static void free_old_nodes(Parser *p) {
  uint i, h;
  PNode *pn = p->pnode_hash.all, *tpn, **lpn;
  SNode *sn = p->snode_hash.all, *tsn, **lsn;
  while (sn) {
    h = SNODE_HASH(sn->state - p->t->state, sn->initial_scope);
    lsn = &p->snode_hash.v[h % p->snode_hash.m];
    tsn = sn;
    sn = sn->all_next;
    while (*lsn != tsn) lsn = &(*lsn)->bucket_next;
    *lsn = (*lsn)->bucket_next;
  }
  sn = p->snode_hash.last_all;
  p->snode_hash.last_all = 0;
  while (sn) {
    tsn = sn;
    sn = sn->all_next;
    unref_sn(p, tsn);
  }
  p->snode_hash.last_all = p->snode_hash.all;
  p->snode_hash.all = NULL;
  while (pn) {
    for (i = 0; i < pn->children.n; i++) {
      while (pn->children.v[i] != pn->children.v[i]->latest) {
        tpn = pn->children.v[i]->latest;
        ref_pn(tpn);
        unref_pn(p, pn->children.v[i]);
        pn->children.v[i] = tpn;
      }
    }
    h = PNODE_HASH(pn->parse_node.start_loc.s, pn->parse_node.end_skip, pn->parse_node.symbol, pn->initial_scope);
    lpn = &p->pnode_hash.v[h % p->pnode_hash.m];
    tpn = pn;
    pn = pn->all_next;
    while (*lpn != tpn) lpn = &(*lpn)->bucket_next;
    *lpn = (*lpn)->bucket_next;
    unref_pn(p, tpn);
  }
  p->pnode_hash.n = 0;
  p->pnode_hash.all = NULL;
}